

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall avilib::AviReader::~AviReader(AviReader *this)

{
  AviReader *this_local;
  
  this->_vptr_AviReader = (_func_int **)&PTR__AviReader_001d1ce0;
  std::ifstream::close();
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque(&this->m_moviOffs);
  std::
  map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
  ::~map(&this->odml_frameIdxs);
  std::
  map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
  ::~map(&this->m_frameIdxs);
  std::
  map<int,_avilib::_avisuperindex_chunk,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
  ::~map(&this->m_superIndex);
  std::ifstream::~ifstream(&this->_f);
  LoggingObject::~LoggingObject(&this->super_LoggingObject);
  return;
}

Assistant:

avilib::AviReader::~AviReader()
{
	_f.close();
}